

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

bool SetProxy(Network net,Proxy *addrProxy)

{
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock5;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (NET_INTERNAL < net) {
    __assert_fail("net >= 0 && net < NET_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                  ,0x2a9,"bool SetProxy(enum Network, const Proxy &)");
  }
  if (addrProxy->m_is_unix_socket == true) {
    bVar3 = IsUnixSocketPath(&addrProxy->m_unix_socket_path);
  }
  else {
    bVar3 = CNetAddr::IsValid((CNetAddr *)addrProxy);
  }
  if (bVar3 != false) {
    local_30._M_device = (mutex_type *)&g_proxyinfo_mutex;
    local_30._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_30);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)(proxyInfo + net),
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)addrProxy);
    uVar1 = (addrProxy->proxy).super_CNetAddr.m_scope_id;
    proxyInfo[net].proxy.super_CNetAddr.m_net = (addrProxy->proxy).super_CNetAddr.m_net;
    proxyInfo[net].proxy.super_CNetAddr.m_scope_id = uVar1;
    proxyInfo[net].proxy.port = (addrProxy->proxy).port;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&proxyInfo[net].m_unix_socket_path,&addrProxy->m_unix_socket_path);
    bVar2 = addrProxy->m_randomize_credentials;
    proxyInfo[net].m_is_unix_socket = addrProxy->m_is_unix_socket;
    proxyInfo[net].m_randomize_credentials = bVar2;
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool SetProxy(enum Network net, const Proxy &addrProxy) {
    assert(net >= 0 && net < NET_MAX);
    if (!addrProxy.IsValid())
        return false;
    LOCK(g_proxyinfo_mutex);
    proxyInfo[net] = addrProxy;
    return true;
}